

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void load_vector_int<QPDF::HSharedObjectEntry,int>
               (BitStream *bit_stream,int nitems,
               vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec,
               int bits_wanted,offset_in_HSharedObjectEntry_to_int field)

{
  pointer pHVar1;
  pointer pHVar2;
  int iVar3;
  unsigned_long uVar4;
  reference pvVar5;
  logic_error *this;
  size_t i;
  ulong __n;
  int nitems_local;
  int bits_wanted_local;
  BitStream *local_48;
  HSharedObjectEntry local_40;
  
  pHVar1 = (vec->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (vec->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  __n = 0;
  nitems_local = nitems;
  bits_wanted_local = bits_wanted;
  local_48 = bit_stream;
  while( true ) {
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&nitems_local);
    if (uVar4 <= __n) break;
    if (pHVar1 == pHVar2) {
      local_40.nobjects_minus_one = 0;
      local_40.delta_group_length = 0;
      local_40.signature_present = 0;
      std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::
      emplace_back<QPDF::HSharedObjectEntry>(vec,&local_40);
    }
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&bits_wanted_local);
    iVar3 = BitStream::getBitsInt(local_48,uVar4);
    pvVar5 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (vec,__n);
    *(int *)((long)&pvVar5->delta_group_length + field) = iVar3;
    __n = __n + 1;
  }
  local_40._0_8_ =
       ((long)(vec->
              super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(vec->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  iVar3 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&local_40);
  if (iVar3 == nitems_local) {
    BitStream::skipToNextByte(local_48);
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"vector has wrong size in load_vector_int");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
load_vector_int(
    BitStream& bit_stream, int nitems, std::vector<T>& vec, int bits_wanted, int_type T::* field)
{
    bool append = vec.empty();
    // nitems times, read bits_wanted from the given bit stream, storing results in the ith vector
    // entry.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        if (append) {
            vec.push_back(T());
        }
        vec.at(i).*field = bit_stream.getBitsInt(QIntC::to_size(bits_wanted));
    }
    if (QIntC::to_int(vec.size()) != nitems) {
        throw std::logic_error("vector has wrong size in load_vector_int");
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    bit_stream.skipToNextByte();
}